

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase241::run(TestCase241 *this)

{
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StructSchema schema;
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> local_d0;
  Maybe<capnp::StructSchema::Field> local_68;
  
  schema.super_Schema.raw = (Schema)((long)schemas::s_9e2e784c915329b6 + 0x48);
  name.content.size_ = 1;
  name.content.ptr = "";
  StructSchema::findFieldByName(&local_68,&schema,name);
  if (local_68.ptr.isSet == true) {
    local_d0.left.ptr.field_1._48_8_ = local_68.ptr.field_1._48_8_;
    local_d0.left.ptr.field_1._56_8_ = local_68.ptr.field_1._56_8_;
    local_d0.left.ptr.field_1.value.proto._reader.data =
         local_68.ptr.field_1.value.proto._reader.data;
    local_d0.left.ptr.field_1.value.proto._reader.pointers =
         local_68.ptr.field_1.value.proto._reader.pointers;
    local_d0.left.ptr.field_1.value.proto._reader.segment =
         local_68.ptr.field_1.value.proto._reader.segment;
    local_d0.left.ptr.field_1.value.proto._reader.capTable =
         local_68.ptr.field_1.value.proto._reader.capTable;
    local_d0.left.ptr.field_1.value.parent.super_Schema.raw =
         local_68.ptr.field_1.value.parent.super_Schema.raw;
    local_d0.left.ptr.field_1._8_8_ = local_68.ptr.field_1._8_8_;
  }
  local_d0.left.ptr.isSet = local_68.ptr.isSet;
  local_d0.result = (bool)(local_68.ptr.isSet ^ 1);
  local_d0.right = (None *)&kj::none;
  local_d0.op.content.ptr = " == ";
  local_d0.op.content.size_ = 5;
  if ((local_68.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"\\\") == kj::none\", _kjCondition"
               ,(char (*) [56])"failed: expected schema.findFieldByName(\"\") == kj::none",&local_d0
              );
  }
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  StructSchema::findFieldByName(&local_68,&schema,name_00);
  if (local_68.ptr.isSet == true) {
    local_d0.left.ptr.field_1._48_8_ = local_68.ptr.field_1._48_8_;
    local_d0.left.ptr.field_1._56_8_ = local_68.ptr.field_1._56_8_;
    local_d0.left.ptr.field_1.value.proto._reader.data =
         local_68.ptr.field_1.value.proto._reader.data;
    local_d0.left.ptr.field_1.value.proto._reader.pointers =
         local_68.ptr.field_1.value.proto._reader.pointers;
    local_d0.left.ptr.field_1.value.proto._reader.segment =
         local_68.ptr.field_1.value.proto._reader.segment;
    local_d0.left.ptr.field_1.value.proto._reader.capTable =
         local_68.ptr.field_1.value.proto._reader.capTable;
    local_d0.left.ptr.field_1.value.parent.super_Schema.raw =
         local_68.ptr.field_1.value.parent.super_Schema.raw;
    local_d0.left.ptr.field_1._8_8_ = local_68.ptr.field_1._8_8_;
  }
  local_d0.left.ptr.isSet = local_68.ptr.isSet;
  local_d0.right = (None *)&kj::none;
  local_d0.op.content.ptr = anon_var_dwarf_43885;
  local_d0.op.content.size_ = 5;
  local_d0.result = local_68.ptr.isSet;
  if ((local_68.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"foo\\\") != kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected schema.findFieldByName(\"foo\") != kj::none",
               &local_d0);
  }
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  StructSchema::findFieldByName(&local_68,&schema,name_01);
  if (local_68.ptr.isSet == true) {
    local_d0.left.ptr.field_1._48_8_ = local_68.ptr.field_1._48_8_;
    local_d0.left.ptr.field_1._56_8_ = local_68.ptr.field_1._56_8_;
    local_d0.left.ptr.field_1.value.proto._reader.data =
         local_68.ptr.field_1.value.proto._reader.data;
    local_d0.left.ptr.field_1.value.proto._reader.pointers =
         local_68.ptr.field_1.value.proto._reader.pointers;
    local_d0.left.ptr.field_1.value.proto._reader.segment =
         local_68.ptr.field_1.value.proto._reader.segment;
    local_d0.left.ptr.field_1.value.proto._reader.capTable =
         local_68.ptr.field_1.value.proto._reader.capTable;
    local_d0.left.ptr.field_1.value.parent.super_Schema.raw =
         local_68.ptr.field_1.value.parent.super_Schema.raw;
    local_d0.left.ptr.field_1._8_8_ = local_68.ptr.field_1._8_8_;
  }
  local_d0.left.ptr.isSet = local_68.ptr.isSet;
  local_d0.right = (None *)&kj::none;
  local_d0.op.content.ptr = anon_var_dwarf_43885;
  local_d0.op.content.size_ = 5;
  local_d0.result = local_68.ptr.isSet;
  if ((local_68.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xf7,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bar\\\") != kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected schema.findFieldByName(\"bar\") != kj::none",
               &local_d0);
  }
  name_02.content.size_ = 7;
  name_02.content.ptr = "before";
  StructSchema::findFieldByName(&local_68,&schema,name_02);
  if (local_68.ptr.isSet == true) {
    local_d0.left.ptr.field_1._48_8_ = local_68.ptr.field_1._48_8_;
    local_d0.left.ptr.field_1._56_8_ = local_68.ptr.field_1._56_8_;
    local_d0.left.ptr.field_1.value.proto._reader.data =
         local_68.ptr.field_1.value.proto._reader.data;
    local_d0.left.ptr.field_1.value.proto._reader.pointers =
         local_68.ptr.field_1.value.proto._reader.pointers;
    local_d0.left.ptr.field_1.value.proto._reader.segment =
         local_68.ptr.field_1.value.proto._reader.segment;
    local_d0.left.ptr.field_1.value.proto._reader.capTable =
         local_68.ptr.field_1.value.proto._reader.capTable;
    local_d0.left.ptr.field_1.value.parent.super_Schema.raw =
         local_68.ptr.field_1.value.parent.super_Schema.raw;
    local_d0.left.ptr.field_1._8_8_ = local_68.ptr.field_1._8_8_;
  }
  local_d0.left.ptr.isSet = local_68.ptr.isSet;
  local_d0.right = (None *)&kj::none;
  local_d0.op.content.ptr = anon_var_dwarf_43885;
  local_d0.op.content.size_ = 5;
  local_d0.result = local_68.ptr.isSet;
  if ((local_68.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"before\\\") != kj::none\", _kjCondition"
               ,(char (*) [62])"failed: expected schema.findFieldByName(\"before\") != kj::none",
               &local_d0);
  }
  name_03.content.size_ = 6;
  name_03.content.ptr = "after";
  StructSchema::findFieldByName(&local_68,&schema,name_03);
  if (local_68.ptr.isSet == true) {
    local_d0.left.ptr.field_1._48_8_ = local_68.ptr.field_1._48_8_;
    local_d0.left.ptr.field_1._56_8_ = local_68.ptr.field_1._56_8_;
    local_d0.left.ptr.field_1.value.proto._reader.data =
         local_68.ptr.field_1.value.proto._reader.data;
    local_d0.left.ptr.field_1.value.proto._reader.pointers =
         local_68.ptr.field_1.value.proto._reader.pointers;
    local_d0.left.ptr.field_1.value.proto._reader.segment =
         local_68.ptr.field_1.value.proto._reader.segment;
    local_d0.left.ptr.field_1.value.proto._reader.capTable =
         local_68.ptr.field_1.value.proto._reader.capTable;
    local_d0.left.ptr.field_1.value.parent.super_Schema.raw =
         local_68.ptr.field_1.value.parent.super_Schema.raw;
    local_d0.left.ptr.field_1._8_8_ = local_68.ptr.field_1._8_8_;
  }
  local_d0.left.ptr.isSet = local_68.ptr.isSet;
  local_d0.right = (None *)&kj::none;
  local_d0.op.content.ptr = anon_var_dwarf_43885;
  local_d0.op.content.size_ = 5;
  local_d0.result = local_68.ptr.isSet;
  if ((local_68.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xf9,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"after\\\") != kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected schema.findFieldByName(\"after\") != kj::none",
               &local_d0);
  }
  return;
}

Assistant:

TEST(Schema, UnnamedUnion) {
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();

  EXPECT_TRUE(schema.findFieldByName("") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("foo") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("bar") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("before") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("after") != kj::none);
}